

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractValues.cpp
# Opt level: O2

void __thiscall TagParser::testCaseResultComplete(TagParser *this,TestCaseResultPtr *caseData)

{
  string *psVar1;
  BatchResultValues *pBVar2;
  TestCaseResultData *pTVar3;
  pointer puVar4;
  pointer puVar5;
  ParseResult PVar6;
  deUint8 *bytes;
  char *tagName;
  int valNdx;
  long lVar7;
  long lVar8;
  Value VVar9;
  CaseValues tagResult;
  TestCaseResult fullResult;
  
  pBVar2 = this->m_result;
  tagResult.casePath._M_dataplus._M_p = (pointer)&tagResult.casePath.field_2;
  tagResult.casePath._M_string_length = 0;
  tagResult.casePath.field_2._M_local_buf[0] = '\0';
  tagResult.statusDetails._M_dataplus._M_p = (pointer)&tagResult.statusDetails.field_2;
  tagResult.statusDetails._M_string_length = 0;
  tagResult.statusDetails.field_2._M_local_buf[0] = '\0';
  tagResult.values.super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tagResult.values.super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tagResult.values.super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::assign((char *)&tagResult);
  psVar1 = &tagResult.statusDetails;
  tagResult.caseType = TESTCASETYPE_SELF_VALIDATE;
  tagResult.statusCode = caseData->m_ptr->m_statusCode;
  std::__cxx11::string::assign((char *)psVar1);
  std::vector<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>::resize
            (&tagResult.values,
             (long)(pBVar2->m_tagNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pBVar2->m_tagNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  pTVar3 = caseData->m_ptr;
  if ((*(int *)&(pTVar3->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
       *(int *)&(pTVar3->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start < 1) ||
     (pTVar3->m_statusCode != TESTSTATUSCODE_LAST)) goto LAB_0010e10a;
  xe::TestCaseResult::TestCaseResult(&fullResult);
  xe::TestResultParser::init(&this->m_testResultParser,(EVP_PKEY_CTX *)&fullResult);
  puVar4 = (caseData->m_ptr->m_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (caseData->m_ptr->m_data).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bytes = (deUint8 *)0x0;
  if (puVar4 != puVar5) {
    bytes = puVar4;
  }
  PVar6 = xe::TestResultParser::parse(&this->m_testResultParser,bytes,(int)puVar5 - (int)puVar4);
  if (PVar6 == PARSERESULT_ERROR ||
      fullResult.super_TestCaseResultHeader.statusCode == TESTSTATUSCODE_LAST) {
    tagName = (char *)CONCAT71((int7)((ulong)bytes >> 8),
                               tagResult.statusCode == TESTSTATUSCODE_LAST &&
                               fullResult.super_TestCaseResultHeader.statusCode !=
                               TESTSTATUSCODE_LAST);
    if (tagResult.statusCode == TESTSTATUSCODE_LAST &&
        fullResult.super_TestCaseResultHeader.statusCode != TESTSTATUSCODE_LAST) goto LAB_0010e0a6;
    if (tagResult.statusCode == TESTSTATUSCODE_LAST) {
      tagResult.statusCode = TESTSTATUSCODE_INTERNAL_ERROR;
      tagName = "Test case result parsing failed";
      std::__cxx11::string::assign((char *)psVar1);
    }
  }
  else {
LAB_0010e0a6:
    tagResult.statusCode = fullResult.super_TestCaseResultHeader.statusCode;
    tagName = (char *)&fullResult.super_TestCaseResultHeader.statusDetails;
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  if (PVar6 != PARSERESULT_ERROR) {
    lVar8 = 8;
    for (lVar7 = 0;
        lVar7 < (int)((ulong)((long)(pBVar2->m_tagNames).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pBVar2->m_tagNames).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar7 = lVar7 + 1) {
      VVar9 = findValueByTag(&fullResult.resultItems,(string *)tagName);
      *(Type *)((long)tagResult.values.
                      super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar8 + -8) = VVar9.m_type;
      ((anon_union_8_2_07d0b834_for_m_value *)
      ((long)&(tagResult.values.
               super__Vector_base<xe::ri::NumericValue,_std::allocator<xe::ri::NumericValue>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_type + lVar8))->int64 =
           (deInt64)VVar9.m_value;
      lVar8 = lVar8 + 0x10;
    }
  }
  xe::TestCaseResult::~TestCaseResult(&fullResult);
LAB_0010e10a:
  BatchResultValues::add(this->m_result,&tagResult);
  CaseValues::~CaseValues(&tagResult);
  return;
}

Assistant:

void testCaseResultComplete (const xe::TestCaseResultPtr& caseData)
	{
		const vector<string>&	tagNames	= m_result.getTagNames();
		CaseValues				tagResult;

		tagResult.casePath		= caseData->getTestCasePath();
		tagResult.caseType		= xe::TESTCASETYPE_SELF_VALIDATE;
		tagResult.statusCode	= caseData->getStatusCode();
		tagResult.statusDetails	= caseData->getStatusDetails();
		tagResult.values.resize(tagNames.size());

		if (caseData->getDataSize() > 0 && caseData->getStatusCode() == xe::TESTSTATUSCODE_LAST)
		{
			xe::TestCaseResult					fullResult;
			xe::TestResultParser::ParseResult	parseResult;

			m_testResultParser.init(&fullResult);
			parseResult = m_testResultParser.parse(caseData->getData(), caseData->getDataSize());

			if ((parseResult != xe::TestResultParser::PARSERESULT_ERROR && fullResult.statusCode != xe::TESTSTATUSCODE_LAST) ||
				(tagResult.statusCode == xe::TESTSTATUSCODE_LAST && fullResult.statusCode != xe::TESTSTATUSCODE_LAST))
			{
				tagResult.statusCode	= fullResult.statusCode;
				tagResult.statusDetails	= fullResult.statusDetails;
			}
			else if (tagResult.statusCode == xe::TESTSTATUSCODE_LAST)
			{
				DE_ASSERT(parseResult == xe::TestResultParser::PARSERESULT_ERROR);
				tagResult.statusCode	= xe::TESTSTATUSCODE_INTERNAL_ERROR;
				tagResult.statusDetails	= "Test case result parsing failed";
			}

			if (parseResult != xe::TestResultParser::PARSERESULT_ERROR)
			{
				for (int valNdx = 0; valNdx < (int)tagNames.size(); valNdx++)
					tagResult.values[valNdx] = findValueByTag(fullResult.resultItems, tagNames[valNdx]);
			}
		}

		m_result.add(tagResult);
	}